

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O0

opj_bool jp2_read_jp2h_v2(opj_jp2_v2_t *jp2,uchar *p_header_data,uint p_header_size,
                         opj_event_mgr_t *p_manager)

{
  opj_bool oVar1;
  opj_event_mgr_t *in_RCX;
  ulong uVar2;
  uint in_EDX;
  uchar *in_RSI;
  opj_jp2_v2_t *in_RDI;
  opj_jp2_header_handler_t *l_current_handler;
  opj_jp2_box_t box;
  OPJ_UINT32 l_current_data_size;
  OPJ_UINT32 l_box_size;
  opj_event_mgr_t *in_stack_ffffffffffffffb8;
  OPJ_UINT32 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  OPJ_UINT32 OVar3;
  uint uVar4;
  uint local_1c;
  uchar *local_18;
  opj_bool local_4;
  
  uVar4 = 0;
  OVar3 = 0;
  if ((in_RDI->jp2_state & 2) == 2) {
    in_RDI->jp2_img_state = 0;
    local_18 = in_RSI;
    for (local_1c = in_EDX; local_1c != 0; local_1c = local_1c - in_stack_ffffffffffffffc4) {
      oVar1 = jp2_read_boxhdr_char
                        ((opj_jp2_box_t *)in_RCX,(OPJ_BYTE *)CONCAT44(uVar4,OVar3),
                         (OPJ_UINT32 *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
                         ,in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
      if (oVar1 == 0) {
        opj_event_msg_v2(in_RCX,1,"Stream error while reading JP2 Header box\n");
        return 0;
      }
      if (local_1c < in_stack_ffffffffffffffc4) {
        opj_event_msg_v2(in_RCX,1,
                         "Stream error while reading JP2 Header box: box length is inconsistent.\n")
        ;
        return 0;
      }
      in_stack_ffffffffffffffb8 = (opj_event_mgr_t *)jp2_img_find_handler(in_stack_ffffffffffffffc8)
      ;
      OVar3 = in_stack_ffffffffffffffc4 - uVar4;
      uVar2 = (ulong)uVar4;
      if (in_stack_ffffffffffffffb8 == (opj_event_mgr_t *)0x0) {
        in_RDI->jp2_img_state = in_RDI->jp2_img_state | 0x80000000;
      }
      else {
        oVar1 = (*in_stack_ffffffffffffffb8->error_handler)(in_RDI,local_18 + uVar2,OVar3,in_RCX);
        if (oVar1 == 0) {
          return 0;
        }
      }
      local_18 = local_18 + uVar2 + OVar3;
    }
    in_RDI->jp2_state = in_RDI->jp2_state | 4;
    local_4 = 1;
  }
  else {
    opj_event_msg_v2(in_RCX,1,"The  box must be the first box in the file.\n");
    local_4 = 0;
  }
  return local_4;
}

Assistant:

opj_bool jp2_read_jp2h_v2(
						opj_jp2_v2_t *jp2,
						unsigned char * p_header_data,
						unsigned int p_header_size,
						opj_event_mgr_t * p_manager
					)
{
	OPJ_UINT32 l_box_size=0, l_current_data_size = 0;
	opj_jp2_box_t box;
	const opj_jp2_header_handler_t * l_current_handler;

	/* preconditions */
	assert(p_header_data != 00);
	assert(jp2 != 00);
	assert(p_manager != 00);

	/* make sure the box is well placed */
	if ((jp2->jp2_state & JP2_STATE_FILE_TYPE) != JP2_STATE_FILE_TYPE ) {
		opj_event_msg_v2(p_manager, EVT_ERROR, "The  box must be the first box in the file.\n");
		return OPJ_FALSE;
	}

	jp2->jp2_img_state = JP2_IMG_STATE_NONE;

	/* iterate while remaining data */
	while (p_header_size > 0) {

		if (! jp2_read_boxhdr_char(&box,p_header_data,&l_box_size,p_header_size, p_manager)) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Stream error while reading JP2 Header box\n");
			return OPJ_FALSE;
		}

		if (box.length > p_header_size) {
			opj_event_msg_v2(p_manager, EVT_ERROR, "Stream error while reading JP2 Header box: box length is inconsistent.\n");
			return OPJ_FALSE;
		}

		l_current_handler = jp2_img_find_handler(box.type);
		l_current_data_size = box.length - l_box_size;
		p_header_data += l_box_size;

		if (l_current_handler != 00) {
			if (! l_current_handler->handler(jp2,p_header_data,l_current_data_size,p_manager)) {
				return OPJ_FALSE;
			}
		}
		else {
			jp2->jp2_img_state |= JP2_IMG_STATE_UNKNOWN;
		}

		p_header_data += l_current_data_size;
		p_header_size -= box.length;
	}

	jp2->jp2_state |= JP2_STATE_HEADER;

	return OPJ_TRUE;
}